

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

fdb_status sb_read_latest(filemgr *file,sb_config sconfig,err_log_callback *log_callback)

{
  _Invoker_type *_func;
  byte bVar1;
  uint uVar2;
  crc_mode_e mode;
  _func_ssize_t_int_void_ptr_size_t_cs_off_t *p_Var3;
  _func_void_char_ptr_size_t *p_Var4;
  ulong uVar5;
  size_t __size;
  fdb_log_levels fVar6;
  undefined8 uVar7;
  long lVar8;
  byte bVar9;
  ulong *buf;
  void *pvVar10;
  filemgr *pfVar11;
  bool bVar12;
  int iVar13;
  uint32_t uVar14;
  sb_config *psVar15;
  ssize_t sVar16;
  void *pvVar17;
  void *pvVar18;
  superblock *psVar19;
  ulong uVar20;
  long lVar21;
  size_t buf_len;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  superblock *sb;
  ulong uVar26;
  ulong auStack_300 [3];
  fdb_log_levels fStack_2e8;
  size_t sStack_2e0;
  superblock local_2d8 [2];
  undefined1 local_d8 [8];
  FdbGcFunc gc;
  ulong local_70;
  fdb_status local_68;
  ulong *local_60;
  void *buf_aligned;
  ulong local_50;
  filemgr *local_48;
  err_log_callback *local_40;
  ulong local_38;
  
  uVar22 = (ulong)sconfig.num_sb;
  local_40 = log_callback;
  if (file->sb == (superblock *)0x0) {
    sStack_2e0 = 0xffffffffffffffff;
    local_70 = 0xffffffffffffffff;
  }
  else {
    local_70 = (file->sb->revnum).super___atomic_base<unsigned_long>._M_i - 1;
    sStack_2e0 = 0x1328e8;
    sb_free(file);
  }
  lVar8 = -(ulong)((uint)sconfig.num_sb * 40000);
  sb = (superblock *)((long)local_2d8 + lVar8);
  *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132916;
  local_48 = file;
  memset(sb,0,uVar22 * 200);
  *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0xffffffffffffffd0;
  local_68 = (fdb_status)*(undefined8 *)((long)local_2d8 + lVar8 + -8);
  uVar26 = 0;
  uVar25 = 0;
  uVar23 = uVar22;
  while (uVar25 != uVar22) {
    local_50 = uVar26;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 1;
    sVar24 = *(size_t *)((long)local_2d8 + lVar8 + -8);
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x13294d;
    psVar15 = (sb_config *)calloc(sVar24,sVar24);
    local_38 = uVar25;
    sb[uVar25].config = psVar15;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x13296c;
    buf_aligned = sb + uVar25;
    _sb_init(sb + uVar25,sconfig);
    pfVar11 = local_48;
    uVar2 = local_48->blocksize;
    local_60 = (ulong *)0x0;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x13298b;
    iVar13 = posix_memalign(&local_60,0x200,(ulong)uVar2);
    if (iVar13 != 0) {
      local_60 = (ulong *)0x0;
    }
    buf = local_60;
    _func = &gc.func._M_invoker;
    gc.func._M_invoker = (_Invoker_type)&local_60;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x1329e2;
    FdbGcFunc::FdbGcFunc((FdbGcFunc *)local_d8,(Func *)_func);
    sVar24 = (size_t)(int)uVar2;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x1329ed;
    std::_Function_base::~_Function_base((_Function_base *)_func);
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x1329fa;
    memset(buf,0,sVar24);
    iVar13 = pfVar11->fd;
    p_Var3 = pfVar11->ops->pread;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132a18;
    sVar16 = (*p_Var3)(iVar13,buf,sVar24,local_38 * sVar24);
    if (uVar2 == (uint)sVar16) {
      bVar1 = *(byte *)((long)buf + (long)(int)(uVar2 - 1));
      if (bVar1 == 0xcc) {
        uVar26 = *buf;
        uVar25 = uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                 (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                 (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                 (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
        *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132a47;
        bVar12 = ver_superblock_support(uVar25);
        pvVar10 = buf_aligned;
        if (bVar12) {
          uVar26 = buf[1];
          LOCK();
          *(ulong *)((long)buf_aligned + 8) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          UNLOCK();
          uVar26 = buf[2];
          LOCK();
          *(ulong *)((long)pvVar10 + 0x10) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          UNLOCK();
          uVar26 = buf[3];
          LOCK();
          *(ulong *)((long)pvVar10 + 0x90) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          UNLOCK();
          uVar26 = buf[4];
          LOCK();
          *(ulong *)((long)pvVar10 + 0x98) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          UNLOCK();
          uVar26 = buf[5];
          LOCK();
          *(ulong *)((long)pvVar10 + 0xb0) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          UNLOCK();
          uVar26 = buf[6];
          *(ulong *)((long)pvVar10 + 0xa0) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          uVar26 = buf[7];
          *(ulong *)((long)pvVar10 + 0xa8) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          uVar26 = buf[8];
          *(ulong *)((long)pvVar10 + 0x78) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          uVar26 = buf[9];
          *(ulong *)((long)pvVar10 + 0x80) =
               uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
               | uVar26 << 0x38;
          uVar26 = buf[10];
          uVar20 = uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                   (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                   (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                   (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
          LOCK();
          *(ulong *)((long)pvVar10 + 0x18) = uVar20;
          UNLOCK();
          uVar26 = buf[0xb];
          if (uVar26 == 0) {
            pvVar17 = (void *)0x0;
          }
          else {
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 1;
            sVar24 = *(size_t *)((long)local_2d8 + lVar8 + -8);
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x68;
            __size = *(size_t *)((long)local_2d8 + lVar8 + -8);
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132aff;
            pvVar17 = calloc(sVar24,__size);
            *(undefined8 *)((long)pvVar17 + 0x10) = 0;
            *(ulong *)((long)pvVar17 + 8) =
                 uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                 (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                 (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                 (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
            *(undefined8 *)((long)pvVar17 + 0x48) = 0xffffffffffffffff;
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 1;
            LOCK();
            *(int *)((long)pvVar17 + 0x60) = (int)*(undefined8 *)((long)local_2d8 + lVar8 + -8);
            UNLOCK();
          }
          LOCK();
          *(undefined8 *)((long)pvVar10 + 0x20) = 0;
          UNLOCK();
          uVar20 = uVar20 + 0x7fffff;
          uVar26 = uVar20 >> 0x17;
          *(ulong *)((long)pvVar10 + 0x70) = uVar26;
          if (0x7fffff < uVar20) {
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 8;
            sVar24 = *(size_t *)((long)local_2d8 + lVar8 + -8);
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132c3b;
            pvVar18 = calloc(uVar26,sVar24);
            *(void **)((long)pvVar10 + 0x60) = pvVar18;
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x38;
            sVar24 = *(size_t *)((long)local_2d8 + lVar8 + -8);
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132c4b;
            pvVar18 = calloc(uVar26,sVar24);
            *(void **)((long)pvVar10 + 0x68) = pvVar18;
          }
          for (lVar21 = 0; uVar26 * 8 != lVar21; lVar21 = lVar21 + 8) {
            uVar20 = *(ulong *)((long)buf + lVar21 + 0x60);
            *(ulong *)(*(long *)((long)pvVar10 + 0x60) + lVar21) =
                 uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                 (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                 (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                 (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
          }
          buf_len = lVar21 + 0x60;
          if (pvVar17 != (void *)0x0) {
            uVar26 = *(long *)((long)pvVar17 + 8) + 0x7fffff;
            uVar20 = uVar26 >> 0x17;
            *(ulong *)((long)pvVar17 + 0x38) = uVar20;
            if (0x7fffff < uVar26) {
              *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 8;
              sVar24 = *(size_t *)((long)local_2d8 + lVar8 + -8);
              *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132ca8;
              pvVar18 = calloc(uVar20,sVar24);
              *(void **)((long)pvVar17 + 0x28) = pvVar18;
              *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x38;
              sVar24 = *(size_t *)((long)local_2d8 + lVar8 + -8);
              *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132cb7;
              pvVar18 = calloc(uVar20,sVar24);
              *(void **)((long)pvVar17 + 0x30) = pvVar18;
            }
            for (uVar26 = 0; uVar20 != uVar26; uVar26 = uVar26 + 1) {
              uVar5 = *(ulong *)((long)buf + buf_len);
              buf_len = buf_len + 8;
              *(ulong *)(*(long *)((long)pvVar17 + 0x28) + uVar26 * 8) =
                   uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                   (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                   (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                   | uVar5 << 0x38;
            }
            *(void **)((long)buf_aligned + 0x88) = pvVar17;
          }
          mode = local_48->crc_mode;
          *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132cfb;
          uVar14 = get_checksum((uint8_t *)buf,buf_len,mode);
          uVar26 = local_50;
          pvVar17 = buf_aligned;
          uVar2 = *(uint *)((long)buf + buf_len);
          bVar9 = 1;
          if (uVar14 != (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18)) {
            pvVar18 = *(void **)((long)buf_aligned + 0x60);
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132d1d;
            free(pvVar18);
            pvVar17 = *(void **)((long)pvVar17 + 0x68);
            *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132d26;
            free(pvVar17);
            *(long *)((long)pvVar10 + 0x60) = 0;
            *(undefined8 *)((long)pvVar10 + 0x68) = 0;
            bVar9 = 0;
            *(undefined8 *)((long)&fStack_2e8 + lVar8) = 3;
            fVar6 = *(fdb_log_levels *)((long)&fStack_2e8 + lVar8);
            *(undefined8 *)((long)&fStack_2e8 + lVar8) = 0xffffffffffffffd0;
            uVar7 = *(undefined8 *)((long)&fStack_2e8 + lVar8);
            *(ulong *)((long)&fStack_2e8 + lVar8) = local_38;
            *(ulong *)((long)auStack_300 + lVar8 + 0x10) = uVar25;
            *(char **)((long)auStack_300 + lVar8 + 8) =
                 "Failed to read the superblock: not supported version (magic: %lu, SB No.: %lu)";
            *(undefined8 *)((long)auStack_300 + lVar8) = 0x132d67;
            fdb_log_impl(local_40,fVar6,(fdb_status)uVar7,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                         ,"_sb_read_given_no",0x613,*(char **)((long)auStack_300 + lVar8 + 8));
          }
        }
        else {
          bVar9 = 0;
          *(undefined8 *)((long)&fStack_2e8 + lVar8) = 3;
          fVar6 = *(fdb_log_levels *)((long)&fStack_2e8 + lVar8);
          *(undefined8 *)((long)&fStack_2e8 + lVar8) = 0xffffffffffffffd0;
          uVar7 = *(undefined8 *)((long)&fStack_2e8 + lVar8);
          *(ulong *)((long)&fStack_2e8 + lVar8) = local_38;
          *(ulong *)((long)auStack_300 + lVar8 + 0x10) = uVar25;
          *(char **)((long)auStack_300 + lVar8 + 8) =
               "Failed to read the superblock: not supported version (magic: %lu, SB No.: %lu)";
          *(undefined8 *)((long)auStack_300 + lVar8) = 0x132bfd;
          fdb_log_impl(local_40,fVar6,(fdb_status)uVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                       ,"_sb_read_given_no",0x59c,*(char **)((long)auStack_300 + lVar8 + 8));
          uVar26 = local_50;
        }
      }
      else {
        bVar9 = 0;
        *(undefined8 *)((long)&fStack_2e8 + lVar8) = 3;
        fVar6 = *(fdb_log_levels *)((long)&fStack_2e8 + lVar8);
        *(undefined8 *)((long)&fStack_2e8 + lVar8) = 0xffffffffffffffd0;
        uVar7 = *(undefined8 *)((long)&fStack_2e8 + lVar8);
        *(ulong *)((long)&fStack_2e8 + lVar8) = local_38;
        *(ulong *)((long)auStack_300 + lVar8 + 0x10) = (ulong)bVar1;
        *(char **)((long)auStack_300 + lVar8 + 8) =
             "Failed to read the superblock: incorrect block marker (marker: %x, SB No.: %lu). Note: this message might be a false alarm if upgrade is running."
        ;
        *(undefined8 *)((long)auStack_300 + lVar8) = 0x132bb7;
        fdb_log_impl(local_40,fVar6,(fdb_status)uVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                     ,"_sb_read_given_no",0x58d,*(char **)((long)auStack_300 + lVar8 + 8));
        uVar26 = local_50;
      }
    }
    else {
      p_Var4 = local_48->ops->get_errno_str;
      *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132b39;
      (*p_Var4)((char *)local_2d8,0x200);
      *(undefined8 *)((long)&fStack_2e8 + lVar8) = 3;
      fVar6 = *(fdb_log_levels *)((long)&fStack_2e8 + lVar8);
      *(undefined8 *)((long)&fStack_2e8 + lVar8) = 0xffffffffffffffd0;
      uVar7 = *(undefined8 *)((long)&fStack_2e8 + lVar8);
      *(superblock **)((long)&fStack_2e8 + lVar8) = local_2d8;
      *(ulong *)((long)auStack_300 + lVar8 + 0x10) = local_38;
      *(char **)((long)auStack_300 + lVar8 + 8) =
           "Failed to read the superblock: file read failure (SB No.: %lu), %s";
      *(undefined8 *)((long)auStack_300 + lVar8) = 0x132b6f;
      fdb_log_impl(local_40,fVar6,(fdb_status)uVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                   ,"_sb_read_given_no",0x582,*(char **)((long)auStack_300 + lVar8 + 8));
      bVar9 = 0;
      uVar26 = local_50;
    }
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132d77;
    FdbGcFunc::~FdbGcFunc((FdbGcFunc *)local_d8);
    uVar25 = *(ulong *)((long)buf_aligned + 8);
    if ((bool)(uVar26 <= uVar25 & bVar9 & uVar25 < local_70)) {
      uVar23 = local_38;
      uVar26 = uVar25;
    }
    uVar25 = local_38 + 1;
  }
  if (uVar23 == uVar22) {
    while (bVar12 = uVar22 != 0, uVar22 = uVar22 - 1, bVar12) {
      *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132dc6;
      _sb_free(sb);
      sb = sb + 1;
    }
  }
  else {
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 1;
    sVar24 = *(size_t *)((long)local_2d8 + lVar8 + -8);
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132ddc;
    psVar19 = (superblock *)calloc(sVar24,200);
    pfVar11 = local_48;
    local_48->sb = psVar19;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132df9;
    _sb_copy(psVar19,sb + uVar23);
    if ((pfVar11->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i != 0xffffffffffffffff)
    {
      LOCK();
      (pfVar11->last_commit).super___atomic_base<unsigned_long>._M_i =
           (long)pfVar11->config->blocksize *
           (pfVar11->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
    }
    psVar19 = pfVar11->sb;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 5;
    uVar7 = *(undefined8 *)((long)local_2d8 + lVar8 + -8);
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132e40;
    atomic_incr_uint64_t(&psVar19->revnum,(memory_order)uVar7);
    psVar19 = pfVar11->sb;
    local_68 = FDB_RESULT_SUCCESS;
    *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132e5a;
    avl_init(&psVar19->bmp_idx,(void *)0x0);
    for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
      if (uVar23 != uVar26) {
        *(undefined8 *)((long)local_2d8 + lVar8 + -8) = 0x132e6e;
        _sb_free(sb);
      }
      sb = sb + 1;
    }
  }
  return local_68;
}

Assistant:

fdb_status sb_read_latest(struct filemgr *file,
                          struct sb_config sconfig,
                          err_log_callback *log_callback)
{
    size_t i, max_sb_no = sconfig.num_sb;
    uint64_t max_revnum = 0;
    uint64_t revnum_limit = (uint64_t)0xffffffffffffffff;
    fdb_status fs;
    struct superblock *sb_arr;

    if (file->sb) {
        // Superblock is already read previously.
        // This means that there are some problems with the current superblock
        // so that we have to read another candidate.

        // Note: 'sb->revnum' denotes the revnum of next superblock to be
        // written, so we need to subtract 1 from it to get the revnum of
        // the current superblock successfully read from the file.
        revnum_limit = atomic_get_uint64_t(&file->sb->revnum) - 1;
        sb_free(file);
    }

    sb_arr = alca(struct superblock,
                  sconfig.num_sb * sizeof(struct superblock));
    memset(sb_arr, 0x0, sconfig.num_sb * sizeof(struct superblock));

    // read all superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        sb_arr[i].config = (struct sb_config*)calloc(1, sizeof(struct sb_config));
        _sb_init(&sb_arr[i], sconfig);
        fs = _sb_read_given_no(file, i, &sb_arr[i], log_callback);

        uint64_t cur_revnum = atomic_get_uint64_t(&sb_arr[i].revnum);
        if (fs == FDB_RESULT_SUCCESS &&
            cur_revnum >= max_revnum &&
            cur_revnum < revnum_limit) {
            max_sb_no = i;
            max_revnum = cur_revnum;
        }
    }

    if (max_sb_no == sconfig.num_sb) {
        // all superblocks are broken
        fs = FDB_RESULT_SB_READ_FAIL;
        for (i=0; i<sconfig.num_sb; ++i) {
            _sb_free(&sb_arr[i]);
        }
        // no readable superblock
        // (if not corrupted, it may be a normal old version file)
        return fs;
    }

    file->sb = (struct superblock*)calloc(1, sizeof(struct superblock));
    _sb_copy(file->sb, &sb_arr[max_sb_no]);

    // set last commit position
    if (atomic_get_uint64_t(&file->sb->cur_alloc_bid) != BLK_NOT_FOUND) {
        atomic_store_uint64_t(&file->last_commit,
                              atomic_get_uint64_t(&file->sb->cur_alloc_bid) *
                              file->config->blocksize);
    } else {
        // otherwise, last_commit == file->pos
        // (already set by filemgr_open() function)
    }

    atomic_incr_uint64_t(&file->sb->revnum);
    avl_init(&file->sb->bmp_idx, NULL);

    // free the other superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        if (i != max_sb_no) {
            _sb_free(&sb_arr[i]);
        }
    }

    return FDB_RESULT_SUCCESS;
}